

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cc
# Opt level: O0

Address __thiscall Range::getLastAddrOpen(Range *this,AddrSpaceManager *manage)

{
  pointer ppAVar1;
  pointer ppAVar2;
  AddrSpaceManager *in_RDX;
  uintb extraout_RDX;
  uintb extraout_RDX_00;
  uintb uVar3;
  Address AVar4;
  uintb local_30;
  uintb curlast;
  AddrSpace *curspc;
  AddrSpaceManager *manage_local;
  Range *this_local;
  
  curlast = (uintb)manage->_vptr_AddrSpaceManager;
  ppAVar1 = (manage->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  ppAVar2 = (pointer)AddrSpace::getHighest((AddrSpace *)curlast);
  if (ppAVar1 == ppAVar2) {
    curlast = (uintb)AddrSpaceManager::getNextSpaceInOrder(in_RDX,(AddrSpace *)curlast);
    local_30 = 0;
  }
  else {
    local_30 = (long)ppAVar1 + 1;
  }
  if (curlast == 0) {
    Address::Address((Address *)this,m_maximal);
    uVar3 = extraout_RDX;
  }
  else {
    Address::Address((Address *)this,(AddrSpace *)curlast,local_30);
    uVar3 = extraout_RDX_00;
  }
  AVar4.offset = uVar3;
  AVar4.base = (AddrSpace *)this;
  return AVar4;
}

Assistant:

Address Range::getLastAddrOpen(const AddrSpaceManager *manage) const

{
  AddrSpace *curspc = spc;
  uintb curlast = last;
  if (curlast == curspc->getHighest()) {
    curspc = manage->getNextSpaceInOrder(curspc);
    curlast = 0;
  }
  else
    curlast += 1;
  if (curspc == (AddrSpace *)0)
    return Address(Address::m_maximal);
  return Address(curspc,curlast);
}